

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

int luv_tty_get_winsize(lua_State *L)

{
  int status;
  int local_28;
  int ret;
  int height;
  int width;
  uv_tty_t *handle;
  lua_State *L_local;
  
  handle = (uv_tty_t *)L;
  _height = luv_check_tty(L,1);
  status = uv_tty_get_winsize(_height,&ret,&local_28);
  if (status < 0) {
    L_local._4_4_ = luv_error((lua_State *)handle,status);
  }
  else {
    lua_pushinteger((lua_State *)handle,(long)ret);
    lua_pushinteger((lua_State *)handle,(long)local_28);
    L_local._4_4_ = 2;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_tty_get_winsize(lua_State* L) {
  uv_tty_t* handle = luv_check_tty(L, 1);
  int width, height;
  int ret = uv_tty_get_winsize(handle, &width, &height);
  if (ret < 0) return luv_error(L, ret);
  lua_pushinteger(L, width);
  lua_pushinteger(L, height);
  return 2;
}